

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputAESEncodeStream.cpp
# Opt level: O2

LongBufferSizeType __thiscall
OutputAESEncodeStream::Write(OutputAESEncodeStream *this,Byte *inBuffer,LongBufferSizeType inSize)

{
  uchar *ibuf;
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  string *psVar5;
  uchar *puVar6;
  LongBufferSizeType __n;
  size_t __n_00;
  PDFDate currentTime;
  string local_118;
  MD5Generator md5;
  
  if (this->mTargetStream == (IByteWriterWithPosition *)0x0) {
    inSize = 0;
  }
  else {
    if (this->mWroteIV == false) {
      MD5Generator::MD5Generator(&md5);
      PDFDate::PDFDate(&currentTime);
      PDFDate::SetToCurrentTime(&currentTime);
      PDFDate::ToString_abi_cxx11_(&local_118,&currentTime);
      MD5Generator::Accumulate(&md5,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      psVar5 = MD5Generator::ToStringAsString_abi_cxx11_(&md5);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = *(undefined4 *)(pcVar1 + 4);
      uVar3 = *(undefined4 *)(pcVar1 + 8);
      uVar4 = *(undefined4 *)(pcVar1 + 0xc);
      *(undefined4 *)this->mIV = *(undefined4 *)pcVar1;
      *(undefined4 *)(this->mIV + 4) = uVar2;
      *(undefined4 *)(this->mIV + 8) = uVar3;
      *(undefined4 *)(this->mIV + 0xc) = uVar4;
      (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[2])
                (this->mTargetStream,this->mIV,0x10);
      this->mWroteIV = true;
      PDFDate::~PDFDate(&currentTime);
      MD5Generator::~MD5Generator(&md5);
    }
    ibuf = this->mIn;
    __n = inSize;
    while (__n != 0) {
      puVar6 = this->mInIndex;
      if (((long)puVar6 - (long)ibuf) + __n < 0x10) {
        memcpy(puVar6,inBuffer + (inSize - __n),__n);
        puVar6 = this->mInIndex + __n;
        __n = 0;
      }
      else {
        __n_00 = 0x10 - ((long)puVar6 - (long)ibuf);
        memcpy(puVar6,inBuffer + (inSize - __n),__n_00);
        aes_cbc_encrypt(ibuf,this->mOut,0x10,this->mIV,(this->mEncrypt).cx);
        (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[2])
                  (this->mTargetStream,this->mOut,0x10);
        __n = __n - __n_00;
        puVar6 = ibuf;
      }
      this->mInIndex = puVar6;
    }
  }
  return inSize;
}

Assistant:

LongBufferSizeType OutputAESEncodeStream::Write(const IOBasicTypes::Byte* inBuffer, IOBasicTypes::LongBufferSizeType inSize) 
{
	if (!mTargetStream)
		return 0;

	// write IV if didn't write yet
	if (!mWroteIV) {
		// create IV and write it to output file [use existing PDFDate]
		MD5Generator md5;
		// encode current time
		PDFDate currentTime;
		currentTime.SetToCurrentTime();
		md5.Accumulate(currentTime.ToString());
		memcpy(mIV, (const unsigned char*)md5.ToStringAsString().c_str(), AES_BLOCK_SIZE); // md5 should give us the desired 16 bytes

																						   // now write mIV to the output stream
		mTargetStream->Write(mIV, AES_BLOCK_SIZE);
		mWroteIV = true;
	}


	// input and existing buffer sizes smaller than block size, so just copy and return


	IOBasicTypes::LongBufferSizeType left = inSize;

	while (left > 0) {
		// if what's left is not enough to finish block, just copy and stop
		if (left + (mInIndex - mIn) < AES_BLOCK_SIZE) {
			memcpy(mInIndex, inBuffer + inSize - left, left);
			mInIndex += left;
			left = 0;
		}
		else {
			// otherwise, enough to fill block. fill, encode and continue
			IOBasicTypes::LongBufferSizeType remainder = AES_BLOCK_SIZE - (mInIndex - mIn);
			memcpy(mInIndex, inBuffer + inSize - left, remainder);

			// encrypt
			mEncrypt.cbc_encrypt(mIn, mOut, AES_BLOCK_SIZE, mIV);
			mTargetStream->Write(mOut, AES_BLOCK_SIZE);
			mInIndex = mIn;
			left -= remainder;
		}
	}

	return inSize;
}